

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ClientConductor.cpp
# Opt level: O3

void __thiscall
aeron::ClientConductor::onErrorResponse
          (ClientConductor *this,int64_t offendingCommandCorrelationId,int32_t errorCode,
          string *errorMessage)

{
  recursive_mutex *__mutex;
  pointer pSVar1;
  pointer pPVar2;
  pointer pEVar3;
  pointer pCVar4;
  int iVar5;
  undefined8 uVar6;
  pointer pSVar7;
  pointer pCVar8;
  long lVar9;
  pointer pPVar10;
  pointer pEVar11;
  pointer pSVar12;
  pointer pPVar13;
  pointer pEVar14;
  pointer pCVar15;
  long lVar16;
  
  __mutex = &this->m_adminLock;
  iVar5 = pthread_mutex_lock((pthread_mutex_t *)__mutex);
  if (iVar5 != 0) {
    uVar6 = std::__throw_system_error(iVar5);
    pthread_mutex_unlock((pthread_mutex_t *)__mutex);
    _Unwind_Resume(uVar6);
  }
  pSVar7 = (this->m_subscriptions).
           super__Vector_base<aeron::ClientConductor::SubscriptionStateDefn,_std::allocator<aeron::ClientConductor::SubscriptionStateDefn>_>
           ._M_impl.super__Vector_impl_data._M_start;
  pSVar1 = (this->m_subscriptions).
           super__Vector_base<aeron::ClientConductor::SubscriptionStateDefn,_std::allocator<aeron::ClientConductor::SubscriptionStateDefn>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  lVar16 = (long)pSVar1 - (long)pSVar7;
  lVar9 = (lVar16 >> 6) * -0x5555555555555555 >> 2;
  if (0 < lVar9) {
    lVar16 = lVar9 + 1;
    pSVar12 = pSVar7 + 2;
    do {
      if (pSVar12[-2].m_registrationId == offendingCommandCorrelationId) {
        pSVar12 = pSVar12 + -2;
        goto LAB_00161cf4;
      }
      if (pSVar12[-1].m_registrationId == offendingCommandCorrelationId) {
        pSVar12 = pSVar12 + -1;
        goto LAB_00161cf4;
      }
      if (pSVar12->m_registrationId == offendingCommandCorrelationId) goto LAB_00161cf4;
      if (pSVar12[1].m_registrationId == offendingCommandCorrelationId) {
        pSVar12 = pSVar12 + 1;
        goto LAB_00161cf4;
      }
      lVar16 = lVar16 + -1;
      pSVar12 = pSVar12 + 4;
    } while (1 < lVar16);
    lVar16 = (long)pSVar1 - (long)(pSVar7 + lVar9 * 4);
    pSVar7 = pSVar7 + lVar9 * 4;
  }
  lVar9 = (lVar16 >> 6) * -0x5555555555555555;
  if (lVar9 == 1) {
LAB_00161cce:
    pSVar12 = pSVar7;
    if (pSVar7->m_registrationId != offendingCommandCorrelationId) {
      pSVar12 = pSVar1;
    }
LAB_00161cf4:
    if (pSVar12 != pSVar1) {
      pSVar12->m_status = ERRORED_MEDIA_DRIVER;
      pSVar12->m_errorCode = errorCode;
      std::__cxx11::string::_M_assign((string *)&pSVar12->m_errorMessage);
      goto LAB_00161fcd;
    }
  }
  else {
    if (lVar9 == 2) {
LAB_00161cc1:
      pSVar12 = pSVar7;
      if (pSVar7->m_registrationId != offendingCommandCorrelationId) {
        pSVar7 = pSVar7 + 1;
        goto LAB_00161cce;
      }
      goto LAB_00161cf4;
    }
    if (lVar9 == 3) {
      pSVar12 = pSVar7;
      if (pSVar7->m_registrationId != offendingCommandCorrelationId) {
        pSVar7 = pSVar7 + 1;
        goto LAB_00161cc1;
      }
      goto LAB_00161cf4;
    }
  }
  pPVar10 = (this->m_publications).
            super__Vector_base<aeron::ClientConductor::PublicationStateDefn,_std::allocator<aeron::ClientConductor::PublicationStateDefn>_>
            ._M_impl.super__Vector_impl_data._M_start;
  pPVar2 = (this->m_publications).
           super__Vector_base<aeron::ClientConductor::PublicationStateDefn,_std::allocator<aeron::ClientConductor::PublicationStateDefn>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  lVar16 = (long)pPVar2 - (long)pPVar10;
  lVar9 = (lVar16 >> 4) * -0x71c71c71c71c71c7 >> 2;
  if (0 < lVar9) {
    lVar16 = lVar9 + 1;
    pPVar13 = pPVar10 + 2;
    do {
      if (pPVar13[-2].m_registrationId == offendingCommandCorrelationId) {
        pPVar13 = pPVar13 + -2;
        goto LAB_00161dea;
      }
      if (pPVar13[-1].m_registrationId == offendingCommandCorrelationId) {
        pPVar13 = pPVar13 + -1;
        goto LAB_00161dea;
      }
      if (pPVar13->m_registrationId == offendingCommandCorrelationId) goto LAB_00161dea;
      if (pPVar13[1].m_registrationId == offendingCommandCorrelationId) {
        pPVar13 = pPVar13 + 1;
        goto LAB_00161dea;
      }
      lVar16 = lVar16 + -1;
      pPVar13 = pPVar13 + 4;
    } while (1 < lVar16);
    lVar16 = (long)pPVar2 - (long)(pPVar10 + lVar9 * 4);
    pPVar10 = pPVar10 + lVar9 * 4;
  }
  lVar9 = (lVar16 >> 4) * -0x71c71c71c71c71c7;
  if (lVar9 == 1) {
LAB_00161dc4:
    pPVar13 = pPVar10;
    if (pPVar10->m_registrationId != offendingCommandCorrelationId) {
      pPVar13 = pPVar2;
    }
LAB_00161dea:
    if (pPVar13 != pPVar2) {
      pPVar13->m_status = ERRORED_MEDIA_DRIVER;
      pPVar13->m_errorCode = errorCode;
      std::__cxx11::string::_M_assign((string *)&pPVar13->m_errorMessage);
      goto LAB_00161fcd;
    }
  }
  else {
    if (lVar9 == 2) {
LAB_00161db7:
      pPVar13 = pPVar10;
      if (pPVar10->m_registrationId != offendingCommandCorrelationId) {
        pPVar10 = pPVar10 + 1;
        goto LAB_00161dc4;
      }
      goto LAB_00161dea;
    }
    if (lVar9 == 3) {
      pPVar13 = pPVar10;
      if (pPVar10->m_registrationId != offendingCommandCorrelationId) {
        pPVar10 = pPVar10 + 1;
        goto LAB_00161db7;
      }
      goto LAB_00161dea;
    }
  }
  pEVar11 = (this->m_exclusivePublications).
            super__Vector_base<aeron::ClientConductor::ExclusivePublicationStateDefn,_std::allocator<aeron::ClientConductor::ExclusivePublicationStateDefn>_>
            ._M_impl.super__Vector_impl_data._M_start;
  pEVar3 = (this->m_exclusivePublications).
           super__Vector_base<aeron::ClientConductor::ExclusivePublicationStateDefn,_std::allocator<aeron::ClientConductor::ExclusivePublicationStateDefn>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  lVar16 = (long)pEVar3 - (long)pEVar11;
  lVar9 = (lVar16 >> 4) * -0x71c71c71c71c71c7 >> 2;
  if (0 < lVar9) {
    lVar16 = lVar9 + 1;
    pEVar14 = pEVar11 + 2;
    do {
      if (pEVar14[-2].m_registrationId == offendingCommandCorrelationId) {
        pEVar14 = pEVar14 + -2;
        goto LAB_00161ed6;
      }
      if (pEVar14[-1].m_registrationId == offendingCommandCorrelationId) {
        pEVar14 = pEVar14 + -1;
        goto LAB_00161ed6;
      }
      if (pEVar14->m_registrationId == offendingCommandCorrelationId) goto LAB_00161ed6;
      if (pEVar14[1].m_registrationId == offendingCommandCorrelationId) {
        pEVar14 = pEVar14 + 1;
        goto LAB_00161ed6;
      }
      lVar16 = lVar16 + -1;
      pEVar14 = pEVar14 + 4;
    } while (1 < lVar16);
    lVar16 = (long)pEVar3 - (long)(pEVar11 + lVar9 * 4);
    pEVar11 = pEVar11 + lVar9 * 4;
  }
  lVar9 = (lVar16 >> 4) * -0x71c71c71c71c71c7;
  if (lVar9 == 1) {
LAB_00161eb0:
    pEVar14 = pEVar11;
    if (pEVar11->m_registrationId != offendingCommandCorrelationId) {
      pEVar14 = pEVar3;
    }
LAB_00161ed6:
    if (pEVar14 != pEVar3) {
      pEVar14->m_status = ERRORED_MEDIA_DRIVER;
      pEVar14->m_errorCode = errorCode;
      std::__cxx11::string::_M_assign((string *)&pEVar14->m_errorMessage);
      goto LAB_00161fcd;
    }
  }
  else {
    if (lVar9 == 2) {
LAB_00161ea3:
      pEVar14 = pEVar11;
      if (pEVar11->m_registrationId != offendingCommandCorrelationId) {
        pEVar11 = pEVar11 + 1;
        goto LAB_00161eb0;
      }
      goto LAB_00161ed6;
    }
    if (lVar9 == 3) {
      pEVar14 = pEVar11;
      if (pEVar11->m_registrationId != offendingCommandCorrelationId) {
        pEVar11 = pEVar11 + 1;
        goto LAB_00161ea3;
      }
      goto LAB_00161ed6;
    }
  }
  pCVar8 = (this->m_counters).
           super__Vector_base<aeron::ClientConductor::CounterStateDefn,_std::allocator<aeron::ClientConductor::CounterStateDefn>_>
           ._M_impl.super__Vector_impl_data._M_start;
  pCVar4 = (this->m_counters).
           super__Vector_base<aeron::ClientConductor::CounterStateDefn,_std::allocator<aeron::ClientConductor::CounterStateDefn>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  lVar16 = (long)pCVar4 - (long)pCVar8;
  lVar9 = (lVar16 >> 5) * -0x5555555555555555 >> 2;
  if (0 < lVar9) {
    lVar16 = lVar9 + 1;
    pCVar15 = pCVar8 + 2;
    do {
      if (pCVar15[-2].m_registrationId == offendingCommandCorrelationId) {
        pCVar15 = pCVar15 + -2;
        goto LAB_00161fb2;
      }
      if (pCVar15[-1].m_registrationId == offendingCommandCorrelationId) {
        pCVar15 = pCVar15 + -1;
        goto LAB_00161fb2;
      }
      if (pCVar15->m_registrationId == offendingCommandCorrelationId) goto LAB_00161fb2;
      if (pCVar15[1].m_registrationId == offendingCommandCorrelationId) {
        pCVar15 = pCVar15 + 1;
        goto LAB_00161fb2;
      }
      lVar16 = lVar16 + -1;
      pCVar15 = pCVar15 + 4;
    } while (1 < lVar16);
    lVar16 = (long)pCVar4 - (long)(pCVar8 + lVar9 * 4);
    pCVar8 = pCVar8 + lVar9 * 4;
  }
  lVar9 = (lVar16 >> 5) * -0x5555555555555555;
  if (lVar9 == 1) {
LAB_00161f93:
    pCVar15 = pCVar8;
    if (pCVar8->m_registrationId != offendingCommandCorrelationId) {
      pCVar15 = pCVar4;
    }
  }
  else if (lVar9 == 2) {
LAB_00161f8a:
    pCVar15 = pCVar8;
    if (pCVar8->m_registrationId != offendingCommandCorrelationId) {
      pCVar8 = pCVar8 + 1;
      goto LAB_00161f93;
    }
  }
  else {
    if (lVar9 != 3) goto LAB_00161fcd;
    pCVar15 = pCVar8;
    if (pCVar8->m_registrationId != offendingCommandCorrelationId) {
      pCVar8 = pCVar8 + 1;
      goto LAB_00161f8a;
    }
  }
LAB_00161fb2:
  if (pCVar15 != pCVar4) {
    pCVar15->m_status = ERRORED_MEDIA_DRIVER;
    pCVar15->m_errorCode = errorCode;
    std::__cxx11::string::_M_assign((string *)&pCVar15->m_errorMessage);
  }
LAB_00161fcd:
  pthread_mutex_unlock((pthread_mutex_t *)__mutex);
  return;
}

Assistant:

void ClientConductor::onErrorResponse(
    std::int64_t offendingCommandCorrelationId,
    std::int32_t errorCode,
    const std::string& errorMessage)
{
    std::lock_guard<std::recursive_mutex> lock(m_adminLock);

    auto subIt = std::find_if(m_subscriptions.begin(), m_subscriptions.end(),
        [offendingCommandCorrelationId](const SubscriptionStateDefn &entry)
        {
            return offendingCommandCorrelationId == entry.m_registrationId;
        });

    if (subIt != m_subscriptions.end())
    {
        (*subIt).m_status = RegistrationStatus::ERRORED_MEDIA_DRIVER;
        (*subIt).m_errorCode = errorCode;
        (*subIt).m_errorMessage = errorMessage;
        return;
    }

    auto pubIt = std::find_if(m_publications.begin(), m_publications.end(),
        [offendingCommandCorrelationId](const PublicationStateDefn &entry)
        {
            return offendingCommandCorrelationId == entry.m_registrationId;
        });

    if (pubIt != m_publications.end())
    {
        (*pubIt).m_status = RegistrationStatus::ERRORED_MEDIA_DRIVER;
        (*pubIt).m_errorCode = errorCode;
        (*pubIt).m_errorMessage = errorMessage;
        return;
    }

    auto exPubIt = std::find_if(m_exclusivePublications.begin(), m_exclusivePublications.end(),
        [offendingCommandCorrelationId](const ExclusivePublicationStateDefn &entry)
        {
            return offendingCommandCorrelationId == entry.m_registrationId;
        });

    if (exPubIt != m_exclusivePublications.end())
    {
        (*exPubIt).m_status = RegistrationStatus::ERRORED_MEDIA_DRIVER;
        (*exPubIt).m_errorCode = errorCode;
        (*exPubIt).m_errorMessage = errorMessage;
        return;
    }

    auto counterIt = std::find_if(m_counters.begin(), m_counters.end(),
        [offendingCommandCorrelationId](const CounterStateDefn &entry)
        {
            return offendingCommandCorrelationId == entry.m_registrationId;
        });

    if (counterIt != m_counters.end())
    {
        (*counterIt).m_status = RegistrationStatus::ERRORED_MEDIA_DRIVER;
        (*counterIt).m_errorCode = errorCode;
        (*counterIt).m_errorMessage = errorMessage;
        return;
    }
}